

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void * malloc_base(void *context,size_t size,stb__alloc_type t,int align)

{
  int iVar1;
  stb__alloc *src_00;
  stb__alloc *s_00;
  stb__nochildren *s_01;
  undefined8 *puVar2;
  uint n;
  stb__chunked *s_2;
  stb__nochildren *s_1;
  stb__alloc *s;
  int align_proposed;
  stb__alloc *src;
  void *p;
  int align_local;
  stb__alloc_type t_local;
  size_t size_local;
  void *context_local;
  
  src_00 = stb__get_context(context);
  n = (uint)size;
  p._0_4_ = align;
  if (align < 1) {
    iVar1 = stb_lowbit8(n);
    s._4_4_ = 1 << ((byte)iVar1 & 0x1f);
    if ((int)s._4_4_ < 0) {
      s._4_4_ = 4;
    }
    if (s._4_4_ == 0) {
      if (size == 0) {
        s._4_4_ = 1;
      }
      else {
        s._4_4_ = 0x100;
      }
    }
    if ((align < 0) && (-align < (int)s._4_4_)) {
      s._4_4_ = -align;
    }
    p._0_4_ = s._4_4_;
  }
  iVar1 = stb_is_pow2((uint)p);
  if (iVar1 != 0) {
    p._4_4_ = t;
    if ((t == STB__nochildren) && (8 < (int)(uint)p)) {
      p._4_4_ = STB__alloc;
    }
    switch(p._4_4_) {
    case STB__nochildren:
      s_01 = (stb__nochildren *)malloc(size + 0x10);
      if (s_01 == (stb__nochildren *)0x0) {
        return (void *)0x0;
      }
      src = (stb__alloc *)(s_01 + 1);
      stb__insert_nochild(src_00,s_01);
      break;
    case STB__chunked:
      if ((uint)p < 8) {
        p._0_4_ = 8;
      }
      puVar2 = (undefined8 *)stb__alloc_chunk(src_00,n,(uint)p,8);
      if (puVar2 == (undefined8 *)0x0) {
        return (void *)0x0;
      }
      *puVar2 = (undefined1 *)((long)&src_00->prevn + 1);
      src = (stb__alloc *)(puVar2 + 1);
      break;
    case STB__alloc:
      s_00 = (stb__alloc *)malloc(size + 0x20);
      if (s_00 == (stb__alloc *)0x0) {
        return (void *)0x0;
      }
      src = s_00 + 1;
      s_00->child = (void *)0x0;
      stb__insert_alloc(src_00,s_00);
      s_00->chunks = (stb__chunk *)&DAT_00000002;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0xb2b,"void *malloc_base(void *, size_t, stb__alloc_type, int)");
    case STB__chunk_raw:
      src = (stb__alloc *)stb__alloc_chunk(src_00,n,(uint)p,0);
      if (src == (stb__alloc *)0x0) {
        return (void *)0x0;
      }
    }
    stb_alloc_count_alloc = stb_alloc_count_alloc + 1;
    return src;
  }
  __assert_fail("stb_is_pow2(align)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                ,0xb01,"void *malloc_base(void *, size_t, stb__alloc_type, int)");
}

Assistant:

static void * malloc_base(void *context, size_t size, stb__alloc_type t, int align)
{
   void *p;

   stb__alloc *src = stb__get_context(context);

   if (align <= 0) {
      // compute worst-case C packed alignment
      // e.g. a 24-byte struct is 8-aligned
      int align_proposed = 1 << stb_lowbit8(size);

      if (align_proposed < 0)
         align_proposed = 4;

      if (align_proposed == 0) {
         if (size == 0)
            align_proposed = 1;
         else
            align_proposed = 256;
      }

      // a negative alignment means 'don't align any larger
      // than this'; so -16 means we align 1,2,4,8, or 16

      if (align < 0) {
         if (align_proposed > -align)
            align_proposed = -align;
      }

      align = align_proposed;
   }

   assert(stb_is_pow2(align));

   // don't cause misalignment when allocating nochildren
   if (t == STB__nochildren && align > 8)
      t = STB__alloc;

   switch (t) {
      case STB__alloc: {
         stb__alloc *s = (stb__alloc *) malloc(size + sizeof(*s));
         if (s == NULL) return NULL;
         p = s+1;
         s->child = NULL;
         stb__insert_alloc(src, s);

         stb__setchunks(s,NULL);
         break;
      }

      case STB__nochildren: {
         stb__nochildren *s = (stb__nochildren *) malloc(size + sizeof(*s));
         if (s == NULL) return NULL;
         p = s+1;
         stb__insert_nochild(src, s);
         break;
      }

      case STB__chunk_raw: {
         p = stb__alloc_chunk(src, size, align, 0);
         if (p == NULL) return NULL;
         break;
      }

      case STB__chunked: {
         stb__chunked *s;
         if (align < sizeof(stb_uintptr)) align = sizeof(stb_uintptr);
         s = (stb__chunked *) stb__alloc_chunk(src, size, align, sizeof(*s));
         if (s == NULL) return NULL;
         stb__setparent(s, src);
         p = s+1;
         break;
      }

      default: p = NULL; assert(0); /* NOTREACHED */
   }

   ++stb_alloc_count_alloc;
   return p;
}